

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMocker<std::error_code_(double)>::PerformDefaultAction
          (FunctionMocker<std::error_code_(double)> *this,ArgumentTuple *args,
          string *call_description)

{
  uint uVar1;
  OnCallSpec<std::error_code_(double)> *this_00;
  Action<std::error_code_(double)> *this_01;
  error_category *peVar2;
  Result RVar3;
  error_code eVar4;
  Result RVar5;
  string message;
  _Head_base<0UL,_double,_false> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 == (OnCallSpec<std::error_code_(double)> *)0x0) {
    std::operator+(&local_30,call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    eVar4 = DefaultValue<std::error_code>::Get();
    peVar2 = eVar4._M_cat;
    uVar1 = eVar4._M_value;
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    this_01 = OnCallSpec<std::error_code_(double)>::GetAction(this_00);
    local_38._M_head_impl =
         (args->super__Tuple_impl<0UL,_double>).super__Head_base<0UL,_double,_false>._M_head_impl;
    RVar3 = Action<std::error_code_(double)>::Perform(this_01,(ArgumentTuple *)&local_38);
    peVar2 = RVar3._M_cat;
    uVar1 = RVar3._M_value;
  }
  RVar5._4_4_ = 0;
  RVar5._M_value = uVar1;
  RVar5._M_cat = peVar2;
  return RVar5;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }